

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

void pushbuff(lua_State *L,void *ud)

{
  StkId pSVar1;
  TString *pTVar2;
  TString *x_;
  TValue *io;
  TString *ts;
  BuffFS *buff;
  void *ud_local;
  lua_State *L_local;
  
  if (*(int *)((long)ud + 0x20) == 1) {
    luaD_throw(L,'\x04');
  }
  if (*(int *)((long)ud + 0x20) == 2) {
    if ((ulong)(*(long *)((long)ud + 0x10) - *(long *)((long)ud + 0x18)) < 3) {
      strcpy((char *)(*(long *)((long)ud + 8) + *(long *)((long)ud + 0x18) + -3),"...");
    }
    else {
      strcpy((char *)(*(long *)((long)ud + 8) + *(long *)((long)ud + 0x18)),"...");
      *(long *)((long)ud + 0x18) = *(long *)((long)ud + 0x18) + 3;
    }
  }
  pTVar2 = luaS_newlstr(L,*(char **)((long)ud + 8),*(size_t *)((long)ud + 0x18));
  pSVar1 = (L->top).p;
  *(TString **)pSVar1 = pTVar2;
  (pSVar1->val).tt_ = pTVar2->tt | 0x40;
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return;
}

Assistant:

static void pushbuff (lua_State *L, void *ud) {
  BuffFS *buff = cast(BuffFS*, ud);
  switch (buff->err) {
    case 1:  /* memory error */
      luaD_throw(L, LUA_ERRMEM);
      break;
    case 2:  /* length overflow: Add "..." at the end of result */
      if (buff->buffsize - buff->blen < 3)
        strcpy(buff->b + buff->blen - 3, "...");  /* 'blen' must be > 3 */
      else {  /* there is enough space left for the "..." */
        strcpy(buff->b + buff->blen, "...");
        buff->blen += 3;
      }
      /* FALLTHROUGH */
    default: {  /* no errors, but it can raise one creating the new string */
      TString *ts = luaS_newlstr(L, buff->b, buff->blen);
      setsvalue2s(L, L->top.p, ts);
      L->top.p++;
    }
  }
}